

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

uint8 * __thiscall
bloaty::Regex::InternalSerializeWithCachedSizesToArray
          (Regex *this,uint8 *target,EpsCopyOutputStream *stream)

{
  string *in_RDX;
  uint8 *in_RSI;
  EpsCopyOutputStream *in_RDI;
  uint32 cached_has_bits;
  Operation in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  uint8 *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar1;
  uint8 *local_50;
  EpsCopyOutputStream *stream_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  uint8 *unknown_fields;
  
  unknown_fields = in_RDI->buffer_;
  uVar2 = 0;
  uVar1 = *(uint *)unknown_fields;
  local_50 = in_RSI;
  stream_00 = in_RDI;
  if ((uVar1 & 1) != 0) {
    _internal_pattern_abi_cxx11_((Regex *)0x1a8970);
    in_stack_ffffffffffffff88 = (uint8 *)std::__cxx11::string::data();
    _internal_pattern_abi_cxx11_((Regex *)0x1a8987);
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               (char *)0x1a89a7);
    _internal_pattern_abi_cxx11_((Regex *)0x1a89bb);
    local_50 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         ((EpsCopyOutputStream *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
                          (uint32)((ulong)in_RDI >> 0x20),in_RDX,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 = in_RDX;
  }
  if ((uVar1 & 2) != 0) {
    _internal_replacement_abi_cxx11_((Regex *)0x1a89ed);
    std::__cxx11::string::data();
    _internal_replacement_abi_cxx11_((Regex *)0x1a8a04);
    std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               (char *)0x1a8a24);
    _internal_replacement_abi_cxx11_((Regex *)0x1a8a38);
    local_50 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         ((EpsCopyOutputStream *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
                          (uint32)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
  }
  if (((uint)in_RDI->buffer_end_ & 1) == 1) {
    if (((uint)in_RDI->buffer_end_ & 1) == 1) {
      google::protobuf::internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->buffer_end_);
    }
    else {
      google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    local_50 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)unknown_fields,
                          (uint8 *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),stream_00);
  }
  return local_50;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Regex::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.Regex)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string pattern = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_pattern().data(), static_cast<int>(this->_internal_pattern().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Regex.pattern");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_pattern(), target);
  }

  // optional string replacement = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_replacement().data(), static_cast<int>(this->_internal_replacement().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Regex.replacement");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_replacement(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.Regex)
  return target;
}